

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asin.c
# Opt level: O2

double c_asin(double x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar1 = x;
  if (x <= -x) {
    dVar1 = -x;
  }
  if (dVar1 <= 1.0) {
    if (dVar1 <= 0.625) {
      if (dVar1 < 1e-08) {
        return x;
      }
      dVar2 = dVar1 * dVar1;
      dVar3 = polevl(dVar2,P,5);
      dVar4 = p1evl(dVar2,Q,5);
      dVar1 = ((dVar3 * dVar2) / dVar4) * dVar1 + dVar1;
    }
    else {
      dVar1 = 1.0 - dVar1;
      dVar2 = polevl(dVar1,R,4);
      dVar3 = p1evl(dVar1,S,4);
      dVar4 = c_sqrt(dVar1 + dVar1);
      dVar1 = ((PIO4 - dVar4) - (((dVar2 * dVar1) / dVar3) * dVar4 + -6.123233995736766e-17)) + PIO4
      ;
    }
    dVar1 = (double)(~-(ulong)(x <= 0.0) & (ulong)dVar1 | (ulong)-dVar1 & -(ulong)(x <= 0.0));
  }
  else {
    mtherr("asin",1);
    dVar1 = NAN;
  }
  return dVar1;
}

Assistant:

double c_asin(x)
double x;
{
double a, p, z, zz;
short sign;

if( x > 0 )
	{
	sign = 1;
	a = x;
	}
else
	{
	sign = -1;
	a = -x;
	}

if( a > 1.0 )
	{
	mtherr( "asin", DOMAIN );
	return( NAN );
	}

if( a > 0.625 )
	{
	/* arcsin(1-x) = pi/2 - sqrt(2x)(1+R(x))  */
	zz = 1.0 - a;
	p = zz * polevl( zz, R, 4)/p1evl( zz, S, 4);
	zz = c_sqrt(zz+zz);
	z = PIO4 - zz;
	zz = zz * p - MOREBITS;
	z = z - zz;
	z = z + PIO4;
	}
else
	{
	if( a < 1.0e-8 )
		{
		return(x);
		}
	zz = a * a;
	z = zz * polevl( zz, P, 5)/p1evl( zz, Q, 5);
	z = a * z + a;
	}
if( sign < 0 )
	z = -z;
return(z);
}